

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_message.cpp
# Opt level: O2

FieldDef * __thiscall
bidfx_public_api::price::pixie::DataDictionaryMessage::ReadFieldDef
          (FieldDef *__return_storage_ptr__,DataDictionaryMessage *this,ByteBuffer *buffer)

{
  FieldTypeEnum type;
  FieldEncodingEnum encoding;
  uint32_t fid;
  uint uVar1;
  uint32_t scale;
  InputStream *stream;
  string name;
  string local_70;
  string local_50;
  
  fid = tools::Varint::ReadU32(&buffer->super_InputStream);
  uVar1 = (**(buffer->super_InputStream)._vptr_InputStream)(buffer);
  type = FieldTypeMethods::ValueOf(uVar1 & 0xff);
  uVar1 = (**(buffer->super_InputStream)._vptr_InputStream)(buffer);
  encoding = FieldEncodingMethods::ValueOf(uVar1 & 0xff);
  scale = tools::Varint::ReadU32(&buffer->super_InputStream);
  tools::Varint::ReadString_abi_cxx11_(&local_50,(Varint *)buffer,stream);
  std::__cxx11::string::string((string *)&local_70,(string *)&local_50);
  FieldDef::FieldDef(__return_storage_ptr__,fid,type,&local_70,encoding,scale);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

FieldDef DataDictionaryMessage::ReadFieldDef(ByteBuffer& buffer)
{
    int fid = Varint::ReadU32(buffer);
    FieldTypeEnum field_type = FieldTypeMethods::ValueOf(buffer.ReadByte());
    FieldEncodingEnum encoding = FieldEncodingMethods::ValueOf(buffer.ReadByte());
    int scale =  Varint::ReadU32(buffer);
    std::string name = Varint::ReadString(buffer);

    return FieldDef(fid, field_type, name, encoding, scale);
}